

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::TParseContext::globalQualifierTypeCheck
          (TParseContext *this,TSourceLoc *loc,TQualifier *qualifier,TPublicType *publicType)

{
  TBasicType TVar1;
  EShLanguage EVar2;
  TSymbolTable *pTVar3;
  TType *pTVar4;
  ulong uVar5;
  int iVar6;
  char *pcVar7;
  uint uVar8;
  char *pcVar9;
  _func_int *UNRECOVERED_JUMPTABLE;
  
  pTVar3 = (this->super_TParseContextBase).symbolTable;
  if (4 < (int)((ulong)((long)(pTVar3->table).
                              super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pTVar3->table).
                             super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
    return;
  }
  if ((((publicType->userDef == (TType *)0x0) ||
       (iVar6 = (*publicType->userDef->_vptr_TType[7])(), iVar6 != 0x12)) &&
      ((this->super_TParseContextBase).parsingBuiltins == false)) &&
     ((((*(ulong *)&qualifier->field_0x8 & 0x1ffc00000000000) != 0 &&
       ((((publicType->basicType != EbtSampler || (((uint)publicType->sampler >> 0x13 & 1) == 0)) ||
         ((uVar8 = (uint)publicType->sampler & 0xff00, uVar8 == 0x800 || (uVar8 == 0x700)))) &&
        ((*(uint *)&(publicType->qualifier).field_0x8 & 0x7f) != 6)))) ||
      ((((*(ulong *)&qualifier->field_0x8 & 0x3ffc00000000000) != 0 &&
        (publicType->basicType != EbtSampler)) &&
       (1 < (*(uint *)&(publicType->qualifier).field_0x8 & 0x7f) - 5)))))) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"memory qualifiers cannot be used on this type");
  }
  if ((((*(uint *)&qualifier->field_0x8 & 0x7f) == 6) && (publicType->basicType != EbtBlock)) &&
     (qualifier->layoutBufferReference == false)) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"buffers can be declared only as blocks","buffer");
  }
  if ((((*(uint *)&qualifier->field_0x8 & 0x7f) != 3) && (publicType->basicType == EbtDouble)) &&
     ((iVar6 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                         (this,"GL_ARB_vertex_attrib_64bit"), (char)iVar6 != '\0' &&
      (((this->super_TParseContextBase).super_TParseVersions.language == EShLangVertex &&
       ((this->super_TParseContextBase).super_TParseVersions.version < 400)))))) {
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,6,0x19a,"GL_ARB_gpu_shader_fp64",
               "vertex-shader `double` type");
  }
  if (1 < (*(uint *)&qualifier->field_0x8 & 0x7f) - 3) {
    return;
  }
  if ((publicType->shaderQualifiers).blendEquation == true) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can only be applied to a standalone \'out\'","blend equation");
  }
  TVar1 = publicType->basicType;
  if ((TVar1 == EbtBool) && ((this->super_TParseContextBase).parsingBuiltins == false)) {
    uVar8 = (uint)*(undefined8 *)&qualifier->field_0x8;
    if ((uVar8 & 0x7f) < 0x1f) {
      pcVar7 = (&PTR_anon_var_dwarf_bac4b0_00942d88)[uVar8 & 0x7f];
    }
    else {
      pcVar7 = "unknown qualifier";
    }
    UNRECOVERED_JUMPTABLE =
         (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
    pcVar9 = "cannot be bool";
    goto LAB_0042aafc;
  }
  if (((TVar1 == EbtDouble) || ((TVar1 - EbtInt8 & 0xfffffff9) == 0)) ||
     ((TVar1 - EbtUint8 & 0xfffffff9) == 0)) {
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,8,300,(char *)0x0,"non-float shader input/output");
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,-9,0x82,(char *)0x0,"non-float shader input/output");
  }
  if ((*(uint *)&qualifier->field_0xa & 0x1c08000) == 0) {
    TVar1 = publicType->basicType;
    if (((TVar1 != EbtDouble) && ((TVar1 - EbtInt8 & 0xfffffff9) != 0)) &&
       ((TVar1 - EbtUint8 & 0xfffffff9) != 0)) {
      pTVar4 = publicType->userDef;
      if (pTVar4 == (TType *)0x0) goto LAB_0042a769;
      iVar6 = (*pTVar4->_vptr_TType[0x32])(pTVar4,8);
      if (((char)iVar6 == '\0') &&
         (iVar6 = (*publicType->userDef->_vptr_TType[0x32])(publicType->userDef,9),
         (char)iVar6 == '\0')) {
        pTVar4 = publicType->userDef;
        iVar6 = (*pTVar4->_vptr_TType[0x32])(pTVar4,6);
        if (((char)iVar6 == '\0') &&
           (iVar6 = (*pTVar4->_vptr_TType[0x32])(pTVar4,7), (char)iVar6 == '\0')) {
          pTVar4 = publicType->userDef;
          iVar6 = (*pTVar4->_vptr_TType[0x32])(pTVar4,4);
          if (((char)iVar6 == '\0') &&
             (iVar6 = (*pTVar4->_vptr_TType[0x32])(pTVar4,5), (char)iVar6 == '\0')) {
            pTVar4 = publicType->userDef;
            iVar6 = (*pTVar4->_vptr_TType[0x32])(pTVar4,10);
            if (((char)iVar6 == '\0') &&
               ((iVar6 = (*pTVar4->_vptr_TType[0x32])(pTVar4,0xb), (char)iVar6 == '\0' &&
                (iVar6 = (*publicType->userDef->_vptr_TType[0x32])(publicType->userDef,2),
                (char)iVar6 == '\0')))) goto LAB_0042a769;
          }
        }
      }
    }
    uVar8 = (uint)*(undefined8 *)&qualifier->field_0x8 & 0x7f;
    EVar2 = (this->super_TParseContextBase).super_TParseVersions.language;
    if ((uVar8 == 3 && EVar2 == EShLangFragment) ||
       (((uVar8 == 4 && (EVar2 == EShLangVertex)) &&
        ((this->super_TParseContextBase).super_TParseVersions.version == 300)))) {
      pcVar7 = TType::getBasicString(publicType->basicType);
      GetStorageQualifierString(*(TStorageQualifier *)&qualifier->field_0x8 & 0x7f);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"must be qualified as flat",pcVar7);
    }
  }
LAB_0042a769:
  if ((*(ulong *)&qualifier->field_0x8 & 0x60c0000000) != 0 &&
      (*(ulong *)&qualifier->field_0x8 >> 0x2c & 1) != 0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"cannot use interpolation qualifiers with patch","patch");
  }
  if (((*(uint *)&qualifier->field_0x8 & 0x7f) == 0xf) && (publicType->basicType == EbtBlock)) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"taskPayloadSharedEXT variables should not be declared as interface blocks",
               "taskPayloadSharedEXT");
  }
  if (((qualifier->field_0xd & 8) != 0) && (publicType->basicType != EbtBlock)) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"taskNV variables can be declared only as blocks","taskNV");
  }
  uVar5 = *(ulong *)&qualifier->field_0x8;
  EVar2 = (this->super_TParseContextBase).super_TParseVersions.language;
  if (((uint)uVar5 & 0x7f) == 3) {
    switch(EVar2) {
    case EShLangVertex:
      if (publicType->basicType != EbtStruct) {
        if (publicType->arraySizes != (TArraySizes *)0x0) {
          TParseVersions::requireProfile((TParseVersions *)this,loc,-9,"vertex input arrays");
          TParseVersions::profileRequires
                    ((TParseVersions *)this,loc,1,0x96,(char *)0x0,"vertex input arrays");
        }
        if (publicType->basicType == EbtDouble) {
          TParseVersions::profileRequires
                    ((TParseVersions *)this,loc,-9,0x19a,"GL_ARB_vertex_attrib_64bit",
                     "vertex-shader `double` type input");
        }
        if ((*(ulong *)&qualifier->field_0x8 & 0x3fff1e0f0000000) == 0) {
          return;
        }
        UNRECOVERED_JUMPTABLE =
             (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
        pcVar9 = "vertex input cannot be further qualified";
        pcVar7 = "";
        goto LAB_0042aafc;
      }
      UNRECOVERED_JUMPTABLE =
           (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
      pcVar9 = "cannot be a structure";
      break;
    case EShLangTessControl:
      if ((uVar5 & 0x100000000000) == 0) {
        return;
      }
      UNRECOVERED_JUMPTABLE =
           (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
      pcVar9 = "can only use on output in tessellation-control shader";
LAB_0042aa99:
      pcVar7 = "patch";
      goto LAB_0042aafc;
    default:
switchD_0042a856_caseD_2:
      return;
    case EShLangFragment:
      if (publicType->userDef == (TType *)0x0) {
        return;
      }
      TParseVersions::profileRequires
                ((TParseVersions *)this,loc,8,300,(char *)0x0,"fragment-shader struct input");
      TParseVersions::profileRequires
                ((TParseVersions *)this,loc,-9,0x96,(char *)0x0,"fragment-shader struct input");
      iVar6 = (*publicType->userDef->_vptr_TType[0x34])();
      if ((char)iVar6 != '\0') {
        TParseVersions::requireProfile
                  ((TParseVersions *)this,loc,-9,"fragment-shader struct input containing structure"
                  );
      }
      iVar6 = (*publicType->userDef->_vptr_TType[0x33])();
      if ((char)iVar6 == '\0') {
        return;
      }
      pcVar7 = "fragment-shader struct input containing an array";
LAB_0042a9fe:
      TParseVersions::requireProfile((TParseVersions *)this,loc,-9,pcVar7);
      return;
    case EShLangCompute:
      pTVar3 = (this->super_TParseContextBase).symbolTable;
      if ((int)((ulong)((long)(pTVar3->table).
                              super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pTVar3->table).
                             super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) < 4) {
        return;
      }
      UNRECOVERED_JUMPTABLE =
           (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
      pcVar9 = "global storage input qualifier cannot be used in a compute shader";
    }
    pcVar7 = "in";
  }
  else {
    switch(EVar2) {
    case EShLangVertex:
      if (publicType->userDef == (TType *)0x0) {
        return;
      }
      TParseVersions::profileRequires
                ((TParseVersions *)this,loc,8,300,(char *)0x0,"vertex-shader struct output");
      TParseVersions::profileRequires
                ((TParseVersions *)this,loc,-9,0x96,(char *)0x0,"vertex-shader struct output");
      iVar6 = (*publicType->userDef->_vptr_TType[0x34])();
      if ((char)iVar6 != '\0') {
        TParseVersions::requireProfile
                  ((TParseVersions *)this,loc,-9,"vertex-shader struct output containing structure")
        ;
      }
      iVar6 = (*publicType->userDef->_vptr_TType[0x33])();
      if ((char)iVar6 == '\0') {
        return;
      }
      pcVar7 = "vertex-shader struct output containing an array";
      goto LAB_0042a9fe;
    default:
      goto switchD_0042a856_caseD_2;
    case EShLangTessEvaluation:
      if ((uVar5 & 0x100000000000) == 0) {
        return;
      }
      UNRECOVERED_JUMPTABLE =
           (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
      pcVar9 = "can only use on input in tessellation-evaluation shader";
      goto LAB_0042aa99;
    case EShLangFragment:
      TParseVersions::profileRequires
                ((TParseVersions *)this,loc,8,300,(char *)0x0,"fragment shader output");
      if (publicType->basicType == EbtStruct) {
        pcVar7 = GetStorageQualifierString(*(TStorageQualifier *)&qualifier->field_0x8 & 0x7f);
        UNRECOVERED_JUMPTABLE =
             (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
        pcVar9 = "cannot be a structure";
      }
      else if ((publicType->field_0xb9 & 0xf) == 0) {
        if ((*(ulong *)&qualifier->field_0x8 & 0x318020000000) != 0) {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"can\'t use auxiliary qualifier on a fragment output",
                     "centroid/sample/patch","");
        }
        if ((*(ulong *)&qualifier->field_0x8 & 0x60c0000000) != 0) {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"can\'t use interpolation qualifier on a fragment output",
                     "flat/smooth/noperspective","");
        }
        if (EbtUint64 < publicType->basicType) {
          return;
        }
        if ((0xc04U >> (publicType->basicType & (EbtNumTypes|EbtFloat16)) & 1) == 0) {
          return;
        }
        pcVar7 = GetStorageQualifierString(*(TStorageQualifier *)&qualifier->field_0x8 & 0x7f);
        UNRECOVERED_JUMPTABLE =
             (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
        pcVar9 = "cannot contain a double, int64, or uint64";
      }
      else {
        pcVar7 = GetStorageQualifierString
                           ((TStorageQualifier)*(ulong *)&qualifier->field_0x8 & 0x7f);
        UNRECOVERED_JUMPTABLE =
             (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
        pcVar9 = "cannot be a matrix";
      }
      break;
    case EShLangCompute:
      UNRECOVERED_JUMPTABLE =
           (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
      pcVar9 = "global storage output qualifier cannot be used in a compute shader";
      pcVar7 = "out";
    }
  }
LAB_0042aafc:
  (*UNRECOVERED_JUMPTABLE)(this,loc,pcVar9,pcVar7,"",UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void TParseContext::globalQualifierTypeCheck(const TSourceLoc& loc, const TQualifier& qualifier, const TPublicType& publicType)
{
    if (! symbolTable.atGlobalLevel())
        return;

    if (!(publicType.userDef && publicType.userDef->isReference()) && !parsingBuiltins) {
        if (qualifier.isMemoryQualifierImageAndSSBOOnly() && ! publicType.isImage() && publicType.qualifier.storage != EvqBuffer) {
            error(loc, "memory qualifiers cannot be used on this type", "", "");
        } else if (qualifier.isMemory() && (publicType.basicType != EbtSampler) && !publicType.qualifier.isUniformOrBuffer()) {
            error(loc, "memory qualifiers cannot be used on this type", "", "");
        }
    }

    if (qualifier.storage == EvqBuffer &&
        publicType.basicType != EbtBlock &&
        !qualifier.hasBufferReference())
        error(loc, "buffers can be declared only as blocks", "buffer", "");

    if (qualifier.storage != EvqVaryingIn && publicType.basicType == EbtDouble &&
        extensionTurnedOn(E_GL_ARB_vertex_attrib_64bit) && language == EShLangVertex &&
        version < 400) {
        profileRequires(loc, ECoreProfile | ECompatibilityProfile, 410, E_GL_ARB_gpu_shader_fp64, "vertex-shader `double` type");
    }
    if (qualifier.storage != EvqVaryingIn && qualifier.storage != EvqVaryingOut)
        return;

    if (publicType.shaderQualifiers.hasBlendEquation())
        error(loc, "can only be applied to a standalone 'out'", "blend equation", "");

    // now, knowing it is a shader in/out, do all the in/out semantic checks

    if (publicType.basicType == EbtBool && !parsingBuiltins) {
        error(loc, "cannot be bool", GetStorageQualifierString(qualifier.storage), "");
        return;
    }

    if (isTypeInt(publicType.basicType) || publicType.basicType == EbtDouble) {
        profileRequires(loc, EEsProfile, 300, nullptr, "non-float shader input/output");
        profileRequires(loc, ~EEsProfile, 130, nullptr, "non-float shader input/output");
    }

    if (!qualifier.flat && !qualifier.isExplicitInterpolation() && !qualifier.isPervertexNV() && !qualifier.isPervertexEXT()) {
        if (isTypeInt(publicType.basicType) ||
            publicType.basicType == EbtDouble ||
            (publicType.userDef && (   publicType.userDef->containsBasicType(EbtInt)
                                    || publicType.userDef->containsBasicType(EbtUint)
                                    || publicType.userDef->contains16BitInt()
                                    || publicType.userDef->contains8BitInt()
                                    || publicType.userDef->contains64BitInt()
                                    || publicType.userDef->containsDouble()))) {
            if (qualifier.storage == EvqVaryingIn && language == EShLangFragment)
                error(loc, "must be qualified as flat", TType::getBasicString(publicType.basicType), GetStorageQualifierString(qualifier.storage));
            else if (qualifier.storage == EvqVaryingOut && language == EShLangVertex && version == 300)
                error(loc, "must be qualified as flat", TType::getBasicString(publicType.basicType), GetStorageQualifierString(qualifier.storage));
        }
    }

    if (qualifier.isPatch() && qualifier.isInterpolation())
        error(loc, "cannot use interpolation qualifiers with patch", "patch", "");

    if (qualifier.isTaskPayload() && publicType.basicType == EbtBlock)
        error(loc, "taskPayloadSharedEXT variables should not be declared as interface blocks", "taskPayloadSharedEXT", "");

    if (qualifier.isTaskMemory() && publicType.basicType != EbtBlock)
        error(loc, "taskNV variables can be declared only as blocks", "taskNV", "");

    if (qualifier.storage == EvqVaryingIn) {
        switch (language) {
        case EShLangVertex:
            if (publicType.basicType == EbtStruct) {
                error(loc, "cannot be a structure", GetStorageQualifierString(qualifier.storage), "");
                return;
            }
            if (publicType.arraySizes) {
                requireProfile(loc, ~EEsProfile, "vertex input arrays");
                profileRequires(loc, ENoProfile, 150, nullptr, "vertex input arrays");
            }
            if (publicType.basicType == EbtDouble)
                profileRequires(loc, ~EEsProfile, 410, E_GL_ARB_vertex_attrib_64bit, "vertex-shader `double` type input");
            if (qualifier.isAuxiliary() || qualifier.isInterpolation() || qualifier.isMemory() || qualifier.invariant)
                error(loc, "vertex input cannot be further qualified", "", "");
            break;
        case EShLangFragment:
            if (publicType.userDef) {
                profileRequires(loc, EEsProfile, 300, nullptr, "fragment-shader struct input");
                profileRequires(loc, ~EEsProfile, 150, nullptr, "fragment-shader struct input");
                if (publicType.userDef->containsStructure())
                    requireProfile(loc, ~EEsProfile, "fragment-shader struct input containing structure");
                if (publicType.userDef->containsArray())
                    requireProfile(loc, ~EEsProfile, "fragment-shader struct input containing an array");
            }
            break;
       case EShLangCompute:
            if (! symbolTable.atBuiltInLevel())
                error(loc, "global storage input qualifier cannot be used in a compute shader", "in", "");
            break;
       case EShLangTessControl:
            if (qualifier.patch)
                error(loc, "can only use on output in tessellation-control shader", "patch", "");
            break;
        default:
            break;
        }
    } else {
        // qualifier.storage == EvqVaryingOut
        switch (language) {
        case EShLangVertex:
            if (publicType.userDef) {
                profileRequires(loc, EEsProfile, 300, nullptr, "vertex-shader struct output");
                profileRequires(loc, ~EEsProfile, 150, nullptr, "vertex-shader struct output");
                if (publicType.userDef->containsStructure())
                    requireProfile(loc, ~EEsProfile, "vertex-shader struct output containing structure");
                if (publicType.userDef->containsArray())
                    requireProfile(loc, ~EEsProfile, "vertex-shader struct output containing an array");
            }

            break;
        case EShLangFragment:
            profileRequires(loc, EEsProfile, 300, nullptr, "fragment shader output");
            if (publicType.basicType == EbtStruct) {
                error(loc, "cannot be a structure", GetStorageQualifierString(qualifier.storage), "");
                return;
            }
            if (publicType.matrixRows > 0) {
                error(loc, "cannot be a matrix", GetStorageQualifierString(qualifier.storage), "");
                return;
            }
            if (qualifier.isAuxiliary())
                error(loc, "can't use auxiliary qualifier on a fragment output", "centroid/sample/patch", "");
            if (qualifier.isInterpolation())
                error(loc, "can't use interpolation qualifier on a fragment output", "flat/smooth/noperspective", "");
            if (publicType.basicType == EbtDouble || publicType.basicType == EbtInt64 || publicType.basicType == EbtUint64)
                error(loc, "cannot contain a double, int64, or uint64", GetStorageQualifierString(qualifier.storage), "");
        break;

        case EShLangCompute:
            error(loc, "global storage output qualifier cannot be used in a compute shader", "out", "");
            break;
        case EShLangTessEvaluation:
            if (qualifier.patch)
                error(loc, "can only use on input in tessellation-evaluation shader", "patch", "");
            break;
        default:
            break;
        }
    }
}